

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall
kratos::DependencyVisitor::visit_block(DependencyVisitor *this,CombinationalStmtBlock *block)

{
  bool bVar1;
  unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
  *this_00;
  reference __k;
  unordered_set<kratos::Stmt*,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<kratos::Stmt*>>
  *this_01;
  unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
  *this_02;
  reference __in;
  type *__k_00;
  type *this_03;
  unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
  *this_04;
  const_iterator __first;
  const_iterator __last;
  type *entry;
  type *var_1;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false>
  local_130;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
  *__range2_1;
  value_type *var;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
  *__range2;
  unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
  *vars;
  undefined1 local_d0 [8];
  CombinationBlockVisitor visitor;
  CombinationalStmtBlock *block_local;
  DependencyVisitor *this_local;
  
  visitor.linked_vars_._M_h._M_single_bucket = (__node_base_ptr)block;
  CombinationBlockVisitor::CombinationBlockVisitor((CombinationBlockVisitor *)local_d0);
  IRVisitor::visit_root((IRVisitor *)local_d0,(IRNode *)visitor.linked_vars_._M_h._M_single_bucket);
  this_00 = CombinationBlockVisitor::vars((CombinationBlockVisitor *)local_d0);
  __end2 = std::
           unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
           ::begin(this_00);
  var = (value_type *)
        std::
        unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
        ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<const_kratos::Var_*,_false>,
                       (_Node_iterator_base<const_kratos::Var_*,_false> *)&var);
    if (!bVar1) break;
    __k = std::__detail::_Node_const_iterator<const_kratos::Var_*,_true,_false>::operator*(&__end2);
    this_01 = (unordered_set<kratos::Stmt*,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<kratos::Stmt*>>
               *)std::
                 unordered_map<const_kratos::Var_*,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>_>
                 ::operator[](&this->dependency_,__k);
    std::
    unordered_set<kratos::Stmt*,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<kratos::Stmt*>>
    ::emplace<kratos::CombinationalStmtBlock*&>
              (this_01,(CombinationalStmtBlock **)&visitor.linked_vars_._M_h._M_single_bucket);
    std::__detail::_Node_const_iterator<const_kratos::Var_*,_true,_false>::operator++(&__end2);
  }
  this_02 = CombinationBlockVisitor::linked_vars((CombinationBlockVisitor *)local_d0);
  __end2_1 = std::
             unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
             ::begin(this_02);
  local_130._M_cur =
       (__node_type *)
       std::
       unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
       ::end(this_02);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2_1.
                        super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false>
                       ,&local_130);
    if (!bVar1) break;
    __in = std::__detail::
           _Node_iterator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false,_false>
           ::operator*(&__end2_1);
    __k_00 = std::
             get<0ul,kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>
                       (__in);
    this_03 = std::
              get<1ul,kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>
                        (__in);
    this_04 = (unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
               *)std::
                 unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
                 ::operator[](&this->linked_dependency_,__k_00);
    __first = std::
              unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
              ::begin(this_03);
    __last = std::
             unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
             ::end(this_03);
    std::
    unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
    ::
    insert<std::__detail::_Node_const_iterator<std::pair<unsigned_int_const,kratos::Var*>,false,false>>
              (this_04,(_Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>
                        )__first.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                         ._M_cur,
               (_Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>)
               __last.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
               ._M_cur);
    std::__detail::
    _Node_iterator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false,_false>
    ::operator++(&__end2_1);
  }
  CombinationBlockVisitor::~CombinationBlockVisitor((CombinationBlockVisitor *)local_d0);
  return;
}

Assistant:

void visit_block(CombinationalStmtBlock *block) {
        CombinationBlockVisitor visitor;
        visitor.visit_root(block);
        auto const &vars = visitor.vars();
        for (auto const &var : vars) dependency_[var].emplace(block);
        for (auto const &[var, entry] : visitor.linked_vars()) {
            linked_dependency_[var].insert(entry.begin(), entry.end());
        }
    }